

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  Snapshot snapshot;
  bool bVar4;
  char *pcVar5;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  string *__x;
  pointer ppcVar7;
  _Alloc_hider _Var8;
  pointer source;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  cmCommandContext local_188;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  undefined1 local_138 [64];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_f8;
  undefined1 local_d8 [104];
  string local_70;
  string *local_50;
  Snapshot local_48;
  
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  pcVar2 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CMAKE_BUILD_TYPE","");
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_d8);
  std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)local_138);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"ADDITIONAL_MAKE_CLEAN_FILES","");
  pcVar5 = cmMakefile::GetProperty(pcVar3,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (pcVar5 != (char *)0x0) {
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
    paVar1 = &local_188.Name.field_2;
    local_188.Name._M_string_length = 0;
    local_188.Name.field_2._M_allocated_capacity =
         local_188.Name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_188.Line = 0;
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    local_188.Name._M_dataplus._M_p = (pointer)paVar1;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_138,snapshot,&local_188);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_d8,(cmListFileBacktrace *)local_138);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.Name._M_dataplus._M_p,
                      local_188.Name.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_138,local_d8);
    local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_138._0_8_ = (cmCompiledGeneratorExpression *)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_138);
    local_188.Name._M_string_length = 0;
    local_188.Name.field_2._M_allocated_capacity =
         local_188.Name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_188.Name._M_dataplus._M_p = (pointer)paVar1;
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        local_158.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (cmLocalGenerator *)this->LocalGenerator,&local_70,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        &local_188.Name);
    std::__cxx11::string::string((string *)local_138,pcVar5,(allocator *)&local_f8);
    cmSystemTools::ExpandListArgument((string *)local_138,&this->CleanFiles,false);
    if ((cmCompiledGeneratorExpression *)local_138._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.Name._M_dataplus._M_p,
                      local_188.Name.field_2._M_allocated_capacity + 1);
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_158);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_d8);
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"CLEAN_NO_CUSTOM","");
  pcVar5 = cmMakefile::GetProperty(pcVar3,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  bVar4 = cmSystemTools::IsOff(pcVar5);
  local_188.Name._M_dataplus._M_p = (pointer)0x0;
  local_188.Name._M_string_length = 0;
  local_188.Name.field_2._M_allocated_capacity = 0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_188,
             &local_70);
  if (local_188.Name._M_dataplus._M_p != (pointer)local_188.Name._M_string_length) {
    local_50 = &(this->super_cmCommonTargetGenerator).ConfigName;
    _Var8._M_p = local_188.Name._M_dataplus._M_p;
    do {
      cc = cmSourceFile::GetCustomCommand(*(cmSourceFile **)_Var8._M_p);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_d8,cc,local_50,
                 (cmLocalGenerator *)this->LocalGenerator);
      GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_d8);
      if (bVar4) {
        pvVar6 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                           ((cmCustomCommandGenerator *)local_d8);
        for (source = (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            source != (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
          cmCommonTargetGenerator::Convert
                    ((string *)local_138,&this->super_cmCommonTargetGenerator,source,START_OUTPUT,
                     UNCHANGED);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CleanFiles,(string *)local_138);
          if ((cmCompiledGeneratorExpression *)local_138._0_8_ !=
              (cmCompiledGeneratorExpression *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_d8);
      _Var8._M_p = _Var8._M_p + 8;
    } while (_Var8._M_p != (pointer)local_188.Name._M_string_length);
  }
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = 0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_d8,
             &local_70);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_d8,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = 0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_138,
             &local_70);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_138,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_158,&local_70);
  if (local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppcVar7 = local_158.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      __x = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ExternalObjects,__x);
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             local_158.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  local_f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_f8,&local_70);
  for (ppcVar7 = local_f8.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar7 !=
      local_f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    WriteObjectRuleFiles(this,*ppcVar7);
  }
  if (local_f8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  if (local_188.Name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_188.Name._M_dataplus._M_p,
                    local_188.Name.field_2._M_allocated_capacity -
                    (long)local_188.Name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if(const char* additional_clean_files =
     this->Makefile->GetProperty
     ("ADDITIONAL_MAKE_CLEAN_FILES"))
    {
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                                            ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(cge->Evaluate(this->LocalGenerator,
                                                    config,
                                                    false,
                                                    this->GeneratorTarget,
                                                    0, 0),
                                      this->CleanFiles);
    }

  // add custom commands to the clean rules?
  const char* clean_no_custom =
    this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = customCommands.begin();
      si != customCommands.end(); ++si)
    {
    cmCustomCommandGenerator ccg(*(*si)->GetCustomCommand(),
                                 this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean)
      {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for(std::vector<std::string>::const_iterator o = outputs.begin();
          o != outputs.end(); ++o)
        {
        this->CleanFiles.push_back
          (this->Convert(*o,
                         cmLocalGenerator::START_OUTPUT,
                         cmLocalGenerator::UNCHANGED));
        }
      }
    }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = externalObjects.begin();
      si != externalObjects.end(); ++si)
    {
    this->ExternalObjects.push_back((*si)->GetFullPath());
    }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = objectSources.begin(); si != objectSources.end(); ++si)
    {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(**si);
    }
}